

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::text_format_unittest::TextFormatTest_CustomPrinterForMessageContent_Test::TestBody
          (TextFormatTest_CustomPrinterForMessageContent_Test *this)

{
  void *pvVar1;
  FastFieldValuePrinter *this_00;
  pointer *__ptr;
  Arena *arena;
  char *message_00;
  AssertionResult gtest_ar;
  CustomMessageContentFieldValuePrinter my_field_printer;
  string text;
  Printer printer;
  TestAllTypes message;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_408;
  AssertHelper local_400;
  internal local_3f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3f0;
  FastFieldValuePrinter local_3e8;
  string local_3e0;
  Printer local_3c0;
  undefined1 local_350 [360];
  RepeatedPtrFieldBase local_1e8 [19];
  
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)local_350,(Arena *)0x0);
  local_350[0x10] = local_350[0x10] | 0x20;
  if ((TestAllTypes_NestedMessage *)local_1e8[7].arena_ == (TestAllTypes_NestedMessage *)0x0) {
    arena = (Arena *)local_350._8_8_;
    if ((local_350._8_8_ & 1) != 0) {
      arena = *(Arena **)(local_350._8_8_ & 0xfffffffffffffffe);
    }
    local_1e8[7].arena_ =
         (Arena *)Arena::DefaultConstruct<proto2_unittest::TestAllTypes_NestedMessage>(arena);
  }
  local_350[0x10] = local_350[0x10] | 0x80;
  if ((ImportMessage *)local_1e8[8]._8_8_ == (ImportMessage *)0x0) {
    if ((local_350._8_8_ & 1) != 0) {
      local_350._8_8_ = *(undefined8 *)(local_350._8_8_ & 0xfffffffffffffffe);
    }
    local_1e8[8]._8_8_ =
         Arena::DefaultConstruct<proto2_unittest_import::ImportMessage>((Arena *)local_350._8_8_);
  }
  (((anon_union_12_1_493b367e_for_ImportMessage_3 *)(local_1e8[8]._8_8_ + 0x10))->_impl_).d_ = 0x2a;
  *(byte *)(local_1e8[8]._8_8_ + 0x10) = *(byte *)(local_1e8[8]._8_8_ + 0x10) | 1;
  protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
            ((RepeatedPtrFieldBase *)(local_350 + 0x138),
             Arena::DefaultConstruct<proto2_unittest::TestAllTypes_NestedMessage>);
  protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
            ((RepeatedPtrFieldBase *)(local_350 + 0x138),
             Arena::DefaultConstruct<proto2_unittest::TestAllTypes_NestedMessage>);
  pvVar1 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (local_1e8,Arena::DefaultConstruct<proto2_unittest_import::ImportMessage>);
  *(undefined4 *)((long)pvVar1 + 0x18) = 0x2b;
  *(byte *)((long)pvVar1 + 0x10) = *(byte *)((long)pvVar1 + 0x10) | 1;
  pvVar1 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (local_1e8,Arena::DefaultConstruct<proto2_unittest_import::ImportMessage>);
  *(undefined4 *)((long)pvVar1 + 0x18) = 0x2c;
  *(byte *)((long)pvVar1 + 0x10) = *(byte *)((long)pvVar1 + 0x10) | 1;
  TextFormat::Printer::Printer(&local_3c0);
  TextFormat::FastFieldValuePrinter::FastFieldValuePrinter(&local_3e8);
  local_3e8._vptr_FastFieldValuePrinter = (_func_int **)&PTR__FastFieldValuePrinter_0191e888;
  this_00 = (FastFieldValuePrinter *)operator_new(8);
  this_00->_vptr_FastFieldValuePrinter = (_func_int **)0x0;
  TextFormat::FastFieldValuePrinter::FastFieldValuePrinter(this_00);
  this_00->_vptr_FastFieldValuePrinter = (_func_int **)&PTR__FastFieldValuePrinter_0191e888;
  TextFormat::Printer::SetDefaultFieldValuePrinter(&local_3c0,this_00);
  local_3e0._M_string_length = 0;
  local_3e0.field_2._M_local_buf[0] = '\0';
  local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
  TextFormat::Printer::PrintToString(&local_3c0,(Message *)local_350,&local_3e0);
  testing::internal::CmpHelperEQ<char[235],std::__cxx11::string>
            (local_3f8,
             "\"optional_nested_message {\\n\" \"}\\n\" \"optional_import_message {\\n\" \"  # REDACTED, 2 bytes\\n\" \"}\\n\" \"repeated_nested_message {\\n\" \"}\\n\" \"repeated_nested_message {\\n\" \"}\\n\" \"repeated_import_message {\\n\" \"  # REDACTED, 2 bytes\\n\" \"}\\n\" \"repeated_import_message {\\n\" \"  # REDACTED, 2 bytes\\n\" \"}\\n\""
             ,"text",(char (*) [235])
                     "optional_nested_message {\n}\noptional_import_message {\n  # REDACTED, 2 bytes\n}\nrepeated_nested_message {\n}\nrepeated_nested_message {\n}\nrepeated_import_message {\n  # REDACTED, 2 bytes\n}\nrepeated_import_message {\n  # REDACTED, 2 bytes\n}\n"
             ,&local_3e0);
  if (local_3f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_408);
    if (local_3f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message_00 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message_00 = (local_3f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_400,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,800,message_00);
    testing::internal::AssertHelper::operator=(&local_400,(Message *)&local_408);
    testing::internal::AssertHelper::~AssertHelper(&local_400);
    if (local_408._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_408._M_head_impl + 8))();
    }
  }
  if (local_3f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3f0,local_3f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,
                    CONCAT71(local_3e0.field_2._M_allocated_capacity._1_7_,
                             local_3e0.field_2._M_local_buf[0]) + 1);
  }
  TextFormat::FastFieldValuePrinter::~FastFieldValuePrinter(&local_3e8);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
  ::destructor_impl((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
                     *)&local_3c0.custom_message_printers_);
  local_3c0.custom_message_printers_.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0xffffffffffffff9d;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
  ::destructor_impl((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
                     *)&local_3c0.custom_printers_);
  local_3c0.custom_printers_.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0xffffffffffffff9d;
  if ((_Tuple_impl<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
       )local_3c0.default_field_value_printer_._M_t.
        super___uniq_ptr_impl<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
        ._M_t.
        super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
        .super__Head_base<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_false>.
        _M_head_impl != (FastFieldValuePrinter *)0x0) {
    (*(*(_func_int ***)
        local_3c0.default_field_value_printer_._M_t.
        super___uniq_ptr_impl<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
        ._M_t.
        super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
        .super__Head_base<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_false>.
        _M_head_impl)[1])();
  }
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_350);
  return;
}

Assistant:

TEST_F(TextFormatTest, CustomPrinterForMessageContent) {
  proto2_unittest::TestAllTypes message;
  message.mutable_optional_nested_message();
  message.mutable_optional_import_message()->set_d(42);
  message.add_repeated_nested_message();
  message.add_repeated_nested_message();
  message.add_repeated_import_message()->set_d(43);
  message.add_repeated_import_message()->set_d(44);
  TextFormat::Printer printer;
  CustomMessageContentFieldValuePrinter my_field_printer;
  printer.SetDefaultFieldValuePrinter(
      new CustomMessageContentFieldValuePrinter());
  std::string text;
  printer.PrintToString(message, &text);
  EXPECT_EQ(
      "optional_nested_message {\n"
      "}\n"
      "optional_import_message {\n"
      "  # REDACTED, 2 bytes\n"
      "}\n"
      "repeated_nested_message {\n"
      "}\n"
      "repeated_nested_message {\n"
      "}\n"
      "repeated_import_message {\n"
      "  # REDACTED, 2 bytes\n"
      "}\n"
      "repeated_import_message {\n"
      "  # REDACTED, 2 bytes\n"
      "}\n",
      text);
}